

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cc
# Opt level: O0

void setPreferredVelocities
               (RVOSimulator *sim,vector<RVO::Vector3,_std::allocator<RVO::Vector3>_> *goals)

{
  Vector3 *pVVar1;
  Vector3 *pVVar2;
  const_reference pVVar3;
  vector<RVO::Vector3,_std::allocator<RVO::Vector3>_> *in_RSI;
  ulong in_RDI;
  float fVar4;
  Vector3 goalVector;
  size_t i;
  Vector3 local_40 [28];
  Vector3 local_24 [12];
  Vector3 *local_18;
  vector<RVO::Vector3,_std::allocator<RVO::Vector3>_> *local_10;
  ulong local_8;
  
  local_18 = (Vector3 *)0x0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    pVVar1 = local_18;
    pVVar2 = (Vector3 *)RVO::RVOSimulator::getNumAgents((RVOSimulator *)0x1023db);
    if (pVVar2 <= pVVar1) break;
    pVVar3 = std::vector<RVO::Vector3,_std::allocator<RVO::Vector3>_>::operator[]
                       (local_10,(size_type)local_18);
    RVO::RVOSimulator::getAgentPosition(local_8);
    RVO::Vector3::operator-(local_24,pVVar3);
    fVar4 = (float)RVO::absSq(local_24);
    if (1.0 < fVar4) {
      RVO::normalize(local_40);
      RVO::Vector3::operator=(local_24,local_40);
      RVO::Vector3::~Vector3(local_40);
    }
    RVO::RVOSimulator::setAgentPrefVelocity(local_8,local_18);
    RVO::Vector3::~Vector3(local_24);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void setPreferredVelocities(RVO::RVOSimulator *sim,
                            const std::vector<RVO::Vector3> &goals) {
  /* Set the preferred velocity to be a vector of unit magnitude (speed) in the
   * direction of the goal.
   */
  for (std::size_t i = 0U; i < sim->getNumAgents(); ++i) {
    RVO::Vector3 goalVector = goals[i] - sim->getAgentPosition(i);

    if (RVO::absSq(goalVector) > 1.0F) {
      goalVector = RVO::normalize(goalVector);
    }

    sim->setAgentPrefVelocity(i, goalVector);
  }
}